

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidCrop2(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  ostream *poVar6;
  ShapeConstraint *pSVar7;
  ShapeRange *pSVar8;
  size_t sVar9;
  RangeValue RVar10;
  allocator<char> local_271;
  string local_270;
  RangeValue local_250;
  allocator<char> local_239;
  string local_238;
  RangeValue local_218;
  allocator<char> local_201;
  string local_200;
  RangeValue local_1e0;
  allocator<char> local_1c9;
  string local_1c8;
  RangeValue local_1a8;
  allocator<char> local_191;
  string local_190;
  RangeValue local_170;
  allocator<char> local_159;
  string local_158;
  RangeValue local_138;
  undefined1 local_128 [8];
  NeuralNetworkShaper shaper;
  undefined1 local_b8 [8];
  Result res;
  CropLayerParams *params;
  NeuralNetworkLayer *cropLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape2;
  FeatureDescription *topIn2;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xea);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0x14c);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input2");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xb);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_crop(this_00);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::Specification::CropLayerParams::add_offset
            ((CropLayerParams *)res.m_message.field_2._8_8_,2);
  CoreML::validate<(MLModelType)500>((Result *)local_b8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_b8);
  if (bVar1) {
    CoreML::NeuralNetworkShaper::NeuralNetworkShaper
              ((NeuralNetworkShaper *)local_128,(Model *)&topIn,true);
    bVar1 = CoreML::NeuralNetworkShaper::isValid((NeuralNetworkShaper *)local_128);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"probs",&local_159);
      pSVar7 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_128,&local_158);
      pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
      RVar10 = CoreML::ShapeRange::minimum(pSVar8);
      local_138._val = RVar10._val;
      local_138._isUnbound = RVar10._isUnbound;
      sVar9 = CoreML::RangeValue::value(&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      if (sVar9 == 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"probs",&local_191);
        pSVar7 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_128,&local_190);
        pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
        RVar10 = CoreML::ShapeRange::maximum(pSVar8);
        local_170._val = RVar10._val;
        local_170._isUnbound = RVar10._isUnbound;
        sVar9 = CoreML::RangeValue::value(&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator(&local_191);
        if (sVar9 == 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c8,"probs",&local_1c9);
          pSVar7 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_128,&local_1c8);
          pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
          RVar10 = CoreML::ShapeRange::minimum(pSVar8);
          local_1a8._val = RVar10._val;
          local_1a8._isUnbound = RVar10._isUnbound;
          sVar9 = CoreML::RangeValue::value(&local_1a8);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::allocator<char>::~allocator(&local_1c9);
          if (sVar9 == 10) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"probs",&local_201);
            pSVar7 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_128,&local_200)
            ;
            pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
            RVar10 = CoreML::ShapeRange::maximum(pSVar8);
            local_1e0._val = RVar10._val;
            local_1e0._isUnbound = RVar10._isUnbound;
            sVar9 = CoreML::RangeValue::value(&local_1e0);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator(&local_201);
            if (sVar9 == 10) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_238,"probs",&local_239);
              pSVar7 = CoreML::NeuralNetworkShaper::shape
                                 ((NeuralNetworkShaper *)local_128,&local_238);
              pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
              RVar10 = CoreML::ShapeRange::minimum(pSVar8);
              local_218._val = RVar10._val;
              local_218._isUnbound = RVar10._isUnbound;
              sVar9 = CoreML::RangeValue::value(&local_218);
              std::__cxx11::string::~string((string *)&local_238);
              std::allocator<char>::~allocator(&local_239);
              if (sVar9 == 0xb) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_270,"probs",&local_271);
                pSVar7 = CoreML::NeuralNetworkShaper::shape
                                   ((NeuralNetworkShaper *)local_128,&local_270);
                pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
                RVar10 = CoreML::ShapeRange::maximum(pSVar8);
                local_250._val = RVar10._val;
                local_250._isUnbound = RVar10._isUnbound;
                sVar9 = CoreML::RangeValue::value(&local_250);
                std::__cxx11::string::~string((string *)&local_270);
                std::allocator<char>::~allocator(&local_271);
                if (sVar9 == 0xb) {
                  m1._oneof_case_[0] = 0;
                }
                else {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar6 = std::operator<<(poVar6,":");
                  poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe9f);
                  poVar6 = std::operator<<(poVar6,": error: ");
                  poVar6 = std::operator<<(poVar6,
                                           "shaper.shape(\"probs\").widthRange().maximum().value() == 11"
                                          );
                  poVar6 = std::operator<<(poVar6," was false, expected true.");
                  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                  m1._oneof_case_[0] = 1;
                }
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar6 = std::operator<<(poVar6,":");
                poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe9e);
                poVar6 = std::operator<<(poVar6,": error: ");
                poVar6 = std::operator<<(poVar6,
                                         "shaper.shape(\"probs\").widthRange().minimum().value() == 11"
                                        );
                poVar6 = std::operator<<(poVar6," was false, expected true.");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
                m1._oneof_case_[0] = 1;
              }
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar6 = std::operator<<(poVar6,":");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe9c);
              poVar6 = std::operator<<(poVar6,": error: ");
              poVar6 = std::operator<<(poVar6,
                                       "shaper.shape(\"probs\").heightRange().maximum().value() == 10"
                                      );
              poVar6 = std::operator<<(poVar6," was false, expected true.");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              m1._oneof_case_[0] = 1;
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar6 = std::operator<<(poVar6,":");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe9b);
            poVar6 = std::operator<<(poVar6,": error: ");
            poVar6 = std::operator<<(poVar6,
                                     "shaper.shape(\"probs\").heightRange().minimum().value() == 10"
                                    );
            poVar6 = std::operator<<(poVar6," was false, expected true.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            m1._oneof_case_[0] = 1;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar6 = std::operator<<(poVar6,":");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe99);
          poVar6 = std::operator<<(poVar6,": error: ");
          poVar6 = std::operator<<(poVar6,
                                   "shaper.shape(\"probs\").channelRange().maximum().value() == 1");
          poVar6 = std::operator<<(poVar6," was false, expected true.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          m1._oneof_case_[0] = 1;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe98);
        poVar6 = std::operator<<(poVar6,": error: ");
        poVar6 = std::operator<<(poVar6,
                                 "shaper.shape(\"probs\").channelRange().minimum().value() == 1");
        poVar6 = std::operator<<(poVar6," was false, expected true.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        m1._oneof_case_[0] = 1;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe96);
      poVar6 = std::operator<<(poVar6,": error: ");
      poVar6 = std::operator<<(poVar6,"shaper.isValid()");
      poVar6 = std::operator<<(poVar6," was false, expected true.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
    shaper.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
    CoreML::NeuralNetworkShaper::~NeuralNetworkShaper((NeuralNetworkShaper *)local_128);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0xe93);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    shaper.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  CoreML::Result::~Result((Result *)local_b8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shaper(m1);
    ML_ASSERT(shaper.isValid());

    ML_ASSERT(shaper.shape("probs").channelRange().minimum().value() == 1);
    ML_ASSERT(shaper.shape("probs").channelRange().maximum().value() == 1);

    ML_ASSERT(shaper.shape("probs").heightRange().minimum().value() == 10);
    ML_ASSERT(shaper.shape("probs").heightRange().maximum().value() == 10);

    ML_ASSERT(shaper.shape("probs").widthRange().minimum().value() == 11);
    ML_ASSERT(shaper.shape("probs").widthRange().maximum().value() == 11);

    return 0;
}